

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDiscardTests.cpp
# Opt level: O2

void deqp::gles3::Functional::evalDiscardDynamic(ShaderEvalContext *c)

{
  Vector<float,_3> local_30;
  VecAccess<float,_4,_3> local_20;
  
  local_30.m_data[2] = (c->coords).m_data[2];
  local_30.m_data._0_8_ = *(undefined8 *)(c->coords).m_data;
  local_20.m_vector = &c->color;
  local_20.m_index[0] = 0;
  local_20.m_index[1] = 1;
  local_20.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_20,&local_30);
  if (0.0 < (c->coords).m_data[0] + (c->coords).m_data[1]) {
    c->isDiscarded = true;
  }
  return;
}

Assistant:

inline void evalDiscardDynamic	(ShaderEvalContext& c) { c.color.xyz() = c.coords.swizzle(0,1,2); if (c.coords.x()+c.coords.y() > 0.0f) c.discard(); }